

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadMessage.cpp
# Opt level: O2

bool __thiscall ReadMessage::fillMe(ReadMessage *this,string *parameter)

{
  int iVar1;
  
  if (this->ParameterCount == 1) {
    if ((parameter->_M_string_length == 0) ||
       (iVar1 = (int)*(parameter->_M_dataplus)._M_p, iVar1 - 0x3aU < 0xfffffff6 || iVar1 == 0x30)) {
LAB_00104310:
      std::__cxx11::string::assign((char *)&(this->super_ServerOperation).statusMessage);
      return false;
    }
    iVar1 = std::__cxx11::stoi(parameter,(size_t *)0x0,10);
    this->MessageNumber = iVar1;
    this->ParameterCount = this->ParameterCount + 1;
  }
  else {
    if (this->ParameterCount != 0) goto LAB_00104347;
    if (7 < parameter->_M_string_length - 2) goto LAB_00104310;
    std::__cxx11::string::_M_assign((string *)&this->User);
    std::__cxx11::string::pop_back();
    this->ParameterCount = this->ParameterCount + 1;
  }
  std::__cxx11::string::assign((char *)&(this->super_ServerOperation).statusMessage);
LAB_00104347:
  return this->ParameterCount != 2;
}

Assistant:

bool ReadMessage::fillMe(string parameter) {
    //fill the needed parameter
    if(ParameterCount == 0){
        if(parameter.length() <= 9 && parameter.length() > 1){ //is the Username given 1-8 chars long?
            User = parameter;
            User.pop_back();
            ParameterCount ++;
            statusMessage = "Message-number:";
        }
        else{
            statusMessage = "Invalid User - Max 8 Characters!";
            return false;
        }
    }
    else if(ParameterCount == 1){
        if(!parameter.empty() && isdigit(parameter[0]) && parameter[0] != '0'){ //is the parameter even a number bigger than 0?
            MessageNumber = stoi(parameter);
            ParameterCount ++;
            statusMessage = EXECUTEPENDING;
        }
        else{
            statusMessage = "Invalid Message Number - Must be integer bigger than 0!";
            return false;
        }
    }

    //check if ready and return true if != 2 and false if all parameters were given
    return ParameterCount != 2;
}